

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O2

RPCHelpMan * getmempoolentry(void)

{
  string name;
  string m_key_name;
  RPCResult result;
  string description;
  string description_00;
  Fallback fallback;
  RPCExamples examples;
  string description_01;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  undefined8 in_stack_fffffffffffffb58;
  undefined8 in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  undefined8 in_stack_fffffffffffffb70;
  _Manager_type in_stack_fffffffffffffb78;
  undefined8 in_stack_fffffffffffffb80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffb88;
  _Vector_impl_data in_stack_fffffffffffffb98;
  _Vector_impl_data in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbc8 [16];
  pointer in_stack_fffffffffffffbd8;
  pointer in_stack_fffffffffffffbe0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbf8 [16];
  undefined1 in_stack_fffffffffffffc08 [56];
  string local_3a8;
  string local_388;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  char *local_328;
  size_type local_320;
  char local_318 [8];
  undefined8 uStack_310;
  string local_308 [32];
  string local_2e8 [32];
  RPCResult local_2c8;
  RPCArgOptions local_240;
  string local_1f8 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1d8;
  undefined1 local_180;
  string local_178 [32];
  RPCArg local_158;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"getmempoolentry",(allocator<char> *)&stack0xfffffffffffffbf7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"\nReturns mempool data for given transaction\n",
             (allocator<char> *)&stack0xfffffffffffffbf6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"txid",(allocator<char> *)&stack0xfffffffffffffbd7);
  local_1d8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_180 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,"The transaction id (must be in mempool)",
             (allocator<char> *)&stack0xfffffffffffffbd6);
  local_240.oneline_description._M_dataplus._M_p = (pointer)&local_240.oneline_description.field_2;
  local_240.skip_type_check = false;
  local_240.oneline_description._M_string_length = 0;
  local_240.oneline_description.field_2._M_local_buf[0] = '\0';
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_240._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffffb60;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb58;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffffb68;
  name.field_2._8_8_ = in_stack_fffffffffffffb70;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffffb80;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffffb78;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffffb88;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffffb98._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffffb98._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffffb98._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffffbb0._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffffbb0._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffffbb0._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffffbc8;
  description_01._M_string_length = (size_type)in_stack_fffffffffffffbe0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbd8;
  description_01.field_2 = in_stack_fffffffffffffbe8;
  opts.oneline_description._M_string_length = in_stack_fffffffffffffc08._0_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffc08._8_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffc08._24_24_;
  opts.hidden = (bool)in_stack_fffffffffffffc08[0x30];
  opts.also_positional = (bool)in_stack_fffffffffffffc08[0x31];
  opts._66_6_ = in_stack_fffffffffffffc08._50_6_;
  opts.skip_type_check = (bool)in_stack_fffffffffffffbf8[0];
  opts._1_7_ = in_stack_fffffffffffffbf8._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbf8._8_8_;
  RPCArg::RPCArg(&local_158,name,(Type)local_178,fallback,description_01,opts);
  __l._M_len = 1;
  __l._M_array = &local_158;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffbd8,__l,
             (allocator_type *)&stack0xfffffffffffffbd5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e8,"",(allocator<char> *)&stack0xfffffffffffffbb7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_308,"",(allocator<char> *)&stack0xfffffffffffffbb6);
  MempoolEntryDescription();
  m_key_name._M_string_length = in_stack_fffffffffffffb60;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb58;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffb68;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffb70;
  description._M_string_length = in_stack_fffffffffffffb80;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb78;
  description.field_2 = in_stack_fffffffffffffb88;
  RPCResult::RPCResult
            (&local_2c8,OBJ,m_key_name,description,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffffb98,
             SUB81(local_2e8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb60;
  result._0_8_ = in_stack_fffffffffffffb58;
  result.m_key_name._M_string_length = in_stack_fffffffffffffb68;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffb70;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffb78;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb80;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffffb88;
  result._64_24_ = in_stack_fffffffffffffb98;
  result._88_24_ = in_stack_fffffffffffffbb0;
  result.m_cond._8_16_ = in_stack_fffffffffffffbc8;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffffbd8;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffbb8,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"getmempoolentry",(allocator<char> *)&stack0xfffffffffffffb97);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"\"mytxid\"",(allocator<char> *)&stack0xfffffffffffffb96);
  HelpExampleCli(&local_368,&local_388,&local_3a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc18,"getmempoolentry",
             (allocator<char> *)&stack0xfffffffffffffb95);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffbf8,"\"mytxid\"",
             (allocator<char> *)&stack0xfffffffffffffb94);
  HelpExampleRpc((string *)&stack0xfffffffffffffc38,(string *)&stack0xfffffffffffffc18,
                 (string *)&stack0xfffffffffffffbf8);
  std::operator+(&local_348,&local_368,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffc38);
  local_328 = local_318;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p == &local_348.field_2) {
    uStack_310 = local_348.field_2._8_8_;
  }
  else {
    local_328 = local_348._M_dataplus._M_p;
  }
  local_320 = local_348._M_string_length;
  local_348._M_string_length = 0;
  local_348.field_2._M_local_buf[0] = '\0';
  description_00._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:566:9)>
       ::_M_invoke;
  description_00._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:566:9)>
                ::_M_manager;
  description_00.field_2 = in_stack_fffffffffffffb88;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffbd8;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbc8._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffffbc8._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffbe0;
  fun.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffbf8._0_8_;
  fun._M_invoker = (_Invoker_type)in_stack_fffffffffffffbf8._8_8_;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_fffffffffffffbe8._M_local_buf;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffb60,&stack0xfffffffffffffb68)),
             description_00,(vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_fffffffffffffb98,
             (RPCResults)in_stack_fffffffffffffbb0,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffb68);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc38);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbf8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc18);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_388);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffbb8);
  RPCResult::~RPCResult(&local_2c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb98);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_2e8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffbd8);
  RPCArg::~RPCArg(&local_158);
  RPCArgOptions::~RPCArgOptions(&local_240);
  std::__cxx11::string::~string(local_1f8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1d8._M_first);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getmempoolentry()
{
    return RPCHelpMan{"getmempoolentry",
        "\nReturns mempool data for given transaction\n",
        {
            {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id (must be in mempool)"},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "", MempoolEntryDescription()},
        RPCExamples{
            HelpExampleCli("getmempoolentry", "\"mytxid\"")
            + HelpExampleRpc("getmempoolentry", "\"mytxid\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    uint256 hash = ParseHashV(request.params[0], "parameter 1");

    const CTxMemPool& mempool = EnsureAnyMemPool(request.context);
    LOCK(mempool.cs);

    const auto entry{mempool.GetEntry(Txid::FromUint256(hash))};
    if (entry == nullptr) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Transaction not in mempool");
    }

    UniValue info(UniValue::VOBJ);
    entryToJSON(mempool, info, *entry);
    return info;
},
    };
}